

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

bool __thiscall cmCTestSVN::LoadModifications(cmCTestSVN *this)

{
  vector<const_char_*,_std::allocator<const_char_*>_> svn_status;
  OutputLogger err;
  StatusParser out;
  vector<const_char_*,_std::allocator<const_char_*>_> local_178;
  OutputLogger local_160;
  StatusParser local_120;
  
  local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x62a708;
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_178,(iterator)0x0,
             (char **)&local_120);
  StatusParser::StatusParser(&local_120,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_160,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"status-err> ");
  RunSVNCommand(this,&local_178,(OutputParser *)&local_120,(OutputParser *)&local_160);
  local_160.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_007830e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.super_LineParser.Line._M_dataplus._M_p !=
      &local_160.super_LineParser.Line.field_2) {
    operator_delete(local_160.super_LineParser.Line._M_dataplus._M_p,
                    local_160.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_120.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__StatusParser_00781398;
  if (local_120.RegexStatus.program != (char *)0x0) {
    operator_delete__(local_120.RegexStatus.program);
  }
  local_120.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_007830e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.super_LineParser.Line._M_dataplus._M_p !=
      &local_120.super_LineParser.Line.field_2) {
    operator_delete(local_120.super_LineParser.Line._M_dataplus._M_p,
                    local_120.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  if (local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool cmCTestSVN::LoadModifications()
{
  // Run "svn status" which reports local modifications.
  std::vector<const char*> svn_status;
  svn_status.push_back("status");
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunSVNCommand(svn_status, &out, &err);
  return true;
}